

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

unsigned_long __thiscall
el::base::TypedConfigurations::getULong(TypedConfigurations *this,string *confVal)

{
  uint uVar1;
  ostream *poVar2;
  char *__nptr;
  string *in_RSI;
  stringstream internalInfoStream;
  bool valid;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb0;
  bool local_201;
  string local_200 [48];
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  bool local_19;
  unsigned_long local_8;
  
  local_19 = true;
  utils::Str::trim((string *)0x26da26);
  uVar1 = std::__cxx11::string::empty();
  local_201 = false;
  if ((uVar1 & 1) == 0) {
    local_30 = std::__cxx11::string::begin();
    local_38 = std::__cxx11::string::end();
    local_28 = (char *)std::
                       find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,el::base::TypedConfigurations::getULong(std::__cxx11::string)::__0>
                                 (local_30,local_38);
    local_48 = std::__cxx11::string::end();
    local_201 = __gnu_cxx::operator==(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  }
  local_19 = local_201;
  if (local_201 == false) {
    local_19 = false;
    std::__cxx11::stringstream::stringstream(local_1d0);
    poVar2 = std::operator<<(local_1c0,"Configuration value not a valid integer [");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::operator<<(poVar2,"]");
    poVar2 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x677);
    poVar2 = std::operator<<(poVar2,") [valid");
    poVar2 = std::operator<<(poVar2,"] WITH MESSAGE \"");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_200);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::stringstream::~stringstream(local_1d0);
    local_8 = 0;
  }
  else {
    __nptr = (char *)std::__cxx11::string::c_str();
    local_8 = atol(__nptr);
  }
  return local_8;
}

Assistant:

unsigned long TypedConfigurations::getULong(std::string confVal) {
  bool valid = true;
  base::utils::Str::trim(confVal);
  valid = !confVal.empty() && std::find_if(confVal.begin(), confVal.end(),
  [](char c) {
    return !base::utils::Str::isDigit(c);
  }) == confVal.end();
  if (!valid) {
    valid = false;
    ELPP_ASSERT(valid, "Configuration value not a valid integer [" << confVal << "]");
    return 0;
  }
  return atol(confVal.c_str());
}